

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O1

void lmpar(double *r,int ldr,int N,int *ipvt,double *diag,double *qtb,double delta,double *par,
          double *x,double *sdiag)

{
  ulong uVar1;
  double *x_00;
  double *x_01;
  ulong uVar2;
  int iVar3;
  double *pdVar4;
  double *pdVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  double *pdVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double local_80;
  double local_58;
  double local_40;
  
  lVar15 = (long)N;
  x_00 = (double *)malloc(lVar15 * 8);
  x_01 = (double *)malloc(lVar15 * 8);
  uVar6 = (ulong)(uint)N;
  uVar14 = N;
  if (0 < N) {
    uVar2 = 0;
    iVar3 = 0;
    pdVar4 = r;
    uVar13 = N;
    do {
      x_00[uVar2] = qtb[uVar2];
      uVar14 = (uint)uVar2;
      if (pdVar4[iVar3] != 0.0) {
        uVar14 = uVar13;
      }
      if (NAN(pdVar4[iVar3])) {
        uVar14 = uVar13;
      }
      if (uVar13 != N) {
        uVar14 = uVar13;
      }
      if ((int)uVar14 < N) {
        x_00[uVar2] = 0.0;
      }
      pdVar4 = pdVar4 + 1;
      iVar3 = iVar3 + N;
      uVar2 = uVar2 + 1;
      uVar13 = uVar14;
    } while (uVar6 != uVar2);
  }
  if (0 < (int)uVar14) {
    uVar2 = 1;
    uVar13 = uVar14;
    uVar7 = uVar14;
    do {
      uVar13 = uVar13 - 1;
      lVar11 = uVar14 - uVar2;
      dVar16 = x_00[lVar11];
      dVar17 = r[(N + 1) * (int)lVar11];
      x_00[lVar11] = dVar16 / dVar17;
      if (0 < lVar11) {
        lVar11 = 0;
        uVar12 = uVar13;
        do {
          x_00[lVar11] = x_00[lVar11] - r[(int)uVar12] * (dVar16 / dVar17);
          uVar12 = uVar12 + N;
          lVar11 = lVar11 + 1;
        } while ((ulong)uVar7 - 1 != lVar11);
      }
      uVar2 = uVar2 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar2 != uVar14 + 1);
  }
  if (0 < N) {
    uVar2 = 0;
    do {
      x[ipvt[uVar2]] = x_00[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar6 != uVar2);
  }
  if (0 < N) {
    uVar2 = 0;
    do {
      x_01[uVar2] = diag[uVar2] * x[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar6 != uVar2);
  }
  dVar16 = enorm(x_01,N);
  local_40 = dVar16 - delta;
  if (delta * 0.1 < local_40) {
    local_58 = 0.0;
    if (N <= (int)uVar14) {
      if (0 < N) {
        uVar2 = 0;
        do {
          x_00[uVar2] = (x_01[ipvt[uVar2]] / dVar16) * diag[ipvt[uVar2]];
          uVar2 = uVar2 + 1;
        } while (uVar6 != uVar2);
      }
      if (0 < N) {
        uVar2 = 0;
        pdVar4 = r;
        do {
          dVar17 = 0.0;
          if (uVar2 != 0) {
            uVar8 = 0;
            pdVar5 = pdVar4;
            do {
              dVar17 = dVar17 + *pdVar5 * x_00[uVar8];
              uVar8 = uVar8 + 1;
              pdVar5 = pdVar5 + uVar6;
            } while (uVar2 != uVar8);
          }
          x_00[uVar2] = (x_00[uVar2] - dVar17) / r[(N + 1) * (int)uVar2];
          uVar2 = uVar2 + 1;
          pdVar4 = pdVar4 + 1;
        } while (uVar2 != uVar6);
      }
      local_58 = enorm(x_00,N);
      local_58 = ((local_40 / delta) / local_58) / local_58;
    }
    if (0 < N) {
      lVar11 = 1;
      uVar2 = 0;
      pdVar4 = r;
      do {
        dVar17 = 0.0;
        lVar9 = 0;
        pdVar5 = pdVar4;
        do {
          dVar17 = dVar17 + *pdVar5 * qtb[lVar9];
          lVar9 = lVar9 + 1;
          pdVar5 = pdVar5 + uVar6;
        } while (lVar11 != lVar9);
        x_00[uVar2] = dVar17 / diag[ipvt[uVar2]];
        uVar2 = uVar2 + 1;
        lVar11 = lVar11 + 1;
        pdVar4 = pdVar4 + 1;
      } while (uVar2 != uVar6);
    }
    dVar17 = enorm(x_00,N);
    local_80 = dVar17 / delta;
    if ((local_80 == 0.0) && (!NAN(local_80))) {
      local_80 = pmin(delta,0.1);
      local_80 = 2.22507385852e-308 / local_80;
    }
    dVar18 = pmax(*par,local_58);
    *par = dVar18;
    dVar18 = pmin(dVar18,local_80);
    dVar16 = (double)(~-(ulong)(dVar18 == 0.0) & (ulong)dVar18 |
                     (ulong)(dVar17 / dVar16) & -(ulong)(dVar18 == 0.0));
    iVar3 = 0;
    while( true ) {
      *par = dVar16;
      if ((dVar16 == 0.0) && (!NAN(dVar16))) {
        dVar16 = pmax(2.22507385852e-308,local_80 * 0.001);
        *par = dVar16;
      }
      dVar16 = *par;
      if (dVar16 < 0.0) {
        dVar16 = sqrt(dVar16);
      }
      else {
        dVar16 = SQRT(dVar16);
      }
      if (0 < N) {
        uVar2 = 0;
        do {
          x_00[uVar2] = diag[uVar2] * dVar16;
          uVar2 = uVar2 + 1;
        } while (uVar6 != uVar2);
      }
      qrsolv(r,(int)x,N,ipvt,x_00,qtb,x,sdiag);
      if (0 < N) {
        uVar2 = 0;
        do {
          x_01[uVar2] = diag[uVar2] * x[uVar2];
          uVar2 = uVar2 + 1;
        } while (uVar6 != uVar2);
      }
      dVar16 = enorm(x_01,N);
      dVar17 = dVar16 - delta;
      if (((ABS(dVar17) <= delta * 0.1) || (iVar3 = iVar3 + 1, iVar3 == 10)) ||
         ((local_58 == 0.0 && (((!NAN(local_58) && (local_40 < 0.0)) && (dVar17 <= local_40))))))
      break;
      if (0 < N) {
        uVar2 = 0;
        do {
          x_00[uVar2] = (x_01[ipvt[uVar2]] / dVar16) * diag[ipvt[uVar2]];
          uVar2 = uVar2 + 1;
        } while (uVar6 != uVar2);
      }
      if (0 < N) {
        uVar2 = uVar6;
        pdVar4 = x_00;
        pdVar5 = r + uVar6;
        uVar8 = 0;
        do {
          dVar16 = x_00[uVar8];
          dVar18 = sdiag[uVar8];
          x_00[uVar8] = dVar16 / dVar18;
          uVar1 = uVar8 + 1;
          if ((long)uVar1 < lVar15 && (long)uVar8 <= lVar15 + -2) {
            uVar8 = 1;
            pdVar10 = pdVar5;
            do {
              pdVar4[uVar8] = pdVar4[uVar8] - *pdVar10 * (dVar16 / dVar18);
              pdVar10 = pdVar10 + uVar6;
              uVar8 = uVar8 + 1;
            } while (uVar2 != uVar8);
          }
          pdVar5 = pdVar5 + uVar6 + 1;
          pdVar4 = pdVar4 + 1;
          uVar2 = uVar2 - 1;
          uVar8 = uVar1;
        } while (uVar1 != uVar6);
      }
      dVar16 = enorm(x_00,N);
      if (0.0 < dVar17) {
        local_58 = pmax(local_58,*par);
      }
      if (dVar17 < 0.0) {
        local_80 = pmin(local_80,*par);
      }
      dVar16 = pmax(local_58,((dVar17 / delta) / dVar16) / dVar16 + *par);
      local_40 = dVar17;
    }
  }
  else {
    *par = 0.0;
  }
  free(x_00);
  free(x_01);
  return;
}

Assistant:

void lmpar(double *r,int ldr,int N,int *ipvt,double *diag,double *qtb,double delta,double *par,double *x,double *sdiag) {
	int i,iter,j,jm1,jp1,k,l,nsing;
	double dxnorm,dwarf,fp,gnorm,parc,parl,paru,p1,p001,sum,temp,zero;
	double *wa1,*wa2;
	/*
	*   This routine is a C translation of Fortran Code by
    *     argonne national laboratory. minpack project. march 1980.
     	  burton s. garbow, kenneth e. hillstrom, jorge j. more

	 * N is a positive integer input variable set to the order of r.

       r is an N by N array. on input the full upper triangle
         must contain the full upper triangle of the matrix r.
         on output the full upper triangle is unaltered, and the
         strict lower triangle contains the strict upper triangle
         (transposed) of the upper triangular matrix s.

       ldr is a positive integer input variable not less than n
         which specifies the leading dimension of the array r.

       ipvt is an integer input array of length N which defines the
         permutation matrix p such that a*p = q*r. column j of p
         is column ipvt(j) of the identity matrix.

       diag is an input array of length N which must contain the
         diagonal elements of the matrix d.

       qtb is an input array of length N which must contain the first
         N elements of the vector (q transpose)*b.

       delta is a positive input variable which specifies an upper
         bound on the euclidean norm of d*x.

       par is a nonnegative variable. on input par contains an
         initial estimate of the levenberg-marquardt parameter.
         on output par contains the final estimate.

       x is an output array of length N which contains the least
         squares solution of the system a*x = b, sqrt(par)*d*x = 0,
         for the output par.

       sdiag is an output array of length N which contains the
         diagonal elements of the upper triangular matrix s.
    */

	wa1 = (double*) malloc(sizeof(double) *N);
	wa2 = (double*) malloc(sizeof(double) *N);

	p1 = 1.0e-01;
	p001 = 1.0e-03;
	zero = 0.0;
	dwarf = 2.22507385852e-308;

	//     compute and store in x the gauss-newton direction. if the
	//     jacobian is rank-deficient, obtain a least squares solution.

	nsing = N;

	for(j = 1; j <= N;++j) {
		wa1[j-1] = qtb[j-1];
		if (r[(j-1)*N+j-1] == zero && nsing == N) {
			nsing = j - 1;
		}
		if (nsing < N) {
			wa1[j-1] = zero;
		}
	}

	if (nsing >= 1) {//50
		for(k = 1; k <= nsing;++k) {
	         j = nsing - k + 1;
	         wa1[j-1] = wa1[j-1]/r[(j-1)*N+j-1];
	         temp = wa1[j-1];
	         jm1 = j - 1;
	         if (jm1 >= 1) {
	        	 for(i = 1; i <= jm1;++i) {
	        		 wa1[i-1] = wa1[i-1] - r[(i-1)*N+j-1]*temp;
	        	 }
	         }
		}
	}//50

	for (j = 0; j < N;++j) {
        l = ipvt[j];
        x[l] = wa1[j];
	}

	//     initialize the iteration counter.
	//     evaluate the function at the origin, and test
	//     for acceptance of the gauss-newton direction.

	iter = 0;

	for(j = 0; j < N;++j) {
		wa2[j] = diag[j]*x[j];
	}

	dxnorm = enorm(wa2,N);
	fp = dxnorm - delta;

	if (fp > p1*delta) {//220
		//     if the jacobian is not rank deficient, the newton
		//    step provides a lower bound, parl, for the zero of
		//     the function. otherwise set this bound to zero.
		parl = zero;

		if (nsing >= N) { //120 nsing only takes values upto N
			for(j = 0; j < N;++j) {
				l = ipvt[j];
				wa1[j] = diag[l]*(wa2[l]/dxnorm);
			}

			for(j = 0; j < N;++j) {//110
		         sum = zero;
		         jm1 = j - 1;
		         if (jm1 >= 0) {//100
		        	 for(i = 0; i <= jm1;++i) {//check
		        		 sum = sum + r[i*N+j]*wa1[i];
		        	 }
		         }//100
		         wa1[j] = (wa1[j] - sum)/r[j*N+j];
			}//110
		      temp = enorm(wa1,N);
		      parl = ((fp/delta)/temp)/temp;
		}//120

		//     calculate an upper bound, paru, for the zero of the function.

		for(j = 0; j < N;++j) {//140
			sum = zero;
			for(i = 0; i <= j;++i) {//check
				sum = sum + r[i*N+j]*qtb[i];
			}
	         l = ipvt[j];
	         wa1[j] = sum/diag[l];
		}//140
		gnorm = enorm(wa1,N);
		paru = gnorm/delta;

		if (paru == zero) {
			paru = dwarf/pmin(delta,p1);
		}

		//     if the input par lies outside of the interval (parl,paru),
		//     set par to the closer endpoint.

	      *par = pmax(*par,parl);
	      *par = pmin(*par,paru);

	      if (*par == zero) {
	    	  *par = gnorm/dxnorm;
	      }
	      //Iteration begins
	      while(1) {
	    	  iter++;
	    	  //        evaluate the function at the current value of par.
	    	  if (*par == zero) {
	    		  *par = pmax(dwarf,p001*paru);
	    	  }
	    	  temp = sqrt(*par);
	    	  for(j = 0; j < N;++j) {
	    		  wa1[j] = temp*diag[j];
	    	  }

	    	  qrsolv(r,ldr,N,ipvt,wa1,qtb,x,sdiag);
	    	  for(j = 0; j < N;++j) {
	              wa2[j] = diag[j]*x[j];
	    	  }

	          dxnorm = enorm(wa2,N);
	          temp = fp;
	          fp = dxnorm - delta;

	          //        if the function is small enough, accept the current value
	          //        of par. also test for the exceptional cases where parl
	          //        is zero or the number of iterations has reached 10.
	          if (fabs(fp) <= p1*delta) {
	        	  break;
	          }

	          if (iter == 10) {
	        	  break;
	          }

	          if (parl == zero && fp <= temp && temp < zero) {
	        	  break;
	          }

	          //        compute the newton correction.

	          for(j = 0;j < N;++j) {//180
	              l = ipvt[j];
	              wa1[j] = diag[l]*(wa2[l]/dxnorm);
	          }//180

	          for(j = 0; j < N;++j) {//210
	              wa1[j] = wa1[j]/sdiag[j];
	              temp = wa1[j];
	              jp1 = j + 1;
	              if (N >= jp1+1) {
	            	  for(i = jp1; i < N;++i) {
	            		  wa1[i] = wa1[i] - r[i*N+j]*temp;
	            	  }
	              }
	          }//210
	          temp = enorm(wa1,N);
	          parc = ((fp/delta)/temp)/temp;
	          //        depending on the sign of the function, update parl or paru.

	          if (fp > zero) {
	        	  parl = pmax(parl,*par);
	          }
	          if (fp < zero) {
	        	  paru = pmin(paru,*par);
	          }

	          //       compute an improved estimate for par.
	          *par = pmax(parl,*par+parc);

	      }

	}//220

	if (iter == 0) {
		*par = zero;
	}

	free(wa1);
	free(wa2);
}